

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O0

string * google::protobuf::compiler::objectivec::
         GetOptionalDeprecatedAttribute<google::protobuf::EnumValueDescriptor>
                   (string *__return_storage_ptr__,EnumValueDescriptor *descriptor,
                   FileDescriptor *file)

{
  EnumValueOptions *this;
  FileOptions *this_00;
  AlphaNum *in_RCX;
  AlphaNum *in_R8;
  AlphaNum *in_R9;
  allocator<char> local_281;
  AlphaNum local_280;
  AlphaNum local_250;
  AlphaNum local_220;
  AlphaNum local_1f0;
  string_view local_1c0;
  AlphaNum local_1b0;
  AlphaNum local_180;
  string_view local_150;
  AlphaNum local_140;
  string local_110;
  AlphaNum local_f0;
  string_view local_c0;
  AlphaNum local_b0;
  string local_80;
  FileDescriptor *local_50;
  FileDescriptor *sourceFile;
  string message;
  bool isFileLevelDeprecation;
  bool isDeprecated;
  FileDescriptor *file_local;
  EnumValueDescriptor *descriptor_local;
  
  this = EnumValueDescriptor::options(descriptor);
  message.field_2._M_local_buf[0xf] = EnumValueOptions::deprecated(this);
  message.field_2._M_local_buf[0xe] = '\0';
  if ((!(bool)message.field_2._M_local_buf[0xf]) && (file != (FileDescriptor *)0x0)) {
    this_00 = FileDescriptor::options(file);
    message.field_2._M_local_buf[0xe] = FileOptions::deprecated(this_00);
    message.field_2._M_local_buf[0xf] = message.field_2._M_local_buf[0xe];
  }
  if (message.field_2._M_local_buf[0xf] == '\0') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_281);
    std::allocator<char>::~allocator(&local_281);
  }
  else {
    std::__cxx11::string::string((string *)&sourceFile);
    local_50 = EnumValueDescriptor::file(descriptor);
    if ((message.field_2._M_local_buf[0xe] & 1U) == 0) {
      local_150 = EnumValueDescriptor::full_name(descriptor);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_140,local_150);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_180," is deprecated (see ");
      local_1c0 = FileDescriptor::name(local_50);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_1b0,local_1c0);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_1f0,").");
      in_R8 = &local_1f0;
      absl::lts_20250127::StrCat_abi_cxx11_
                (&local_110,(lts_20250127 *)&local_140,&local_180,&local_1b0,in_R8,in_R9);
      std::__cxx11::string::operator=((string *)&sourceFile,(string *)&local_110);
      std::__cxx11::string::~string((string *)&local_110);
    }
    else {
      local_c0 = FileDescriptor::name(local_50);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_b0,local_c0);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_f0," is deprecated.");
      absl::lts_20250127::StrCat_abi_cxx11_(&local_80,(lts_20250127 *)&local_b0,&local_f0,in_RCX);
      std::__cxx11::string::operator=((string *)&sourceFile,(string *)&local_80);
      std::__cxx11::string::~string((string *)&local_80);
    }
    absl::lts_20250127::AlphaNum::AlphaNum(&local_220,"GPB_DEPRECATED_MSG(\"");
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
              (&local_250,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sourceFile);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_280,"\")");
    absl::lts_20250127::StrCat_abi_cxx11_
              (__return_storage_ptr__,(lts_20250127 *)&local_220,&local_250,&local_280,in_R8);
    std::__cxx11::string::~string((string *)&sourceFile);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetOptionalDeprecatedAttribute(
    const TDescriptor* descriptor, const FileDescriptor* file = nullptr) {
  bool isDeprecated = descriptor->options().deprecated();
  // The file is only passed when checking Messages & Enums, so those types
  // get tagged. At the moment, it doesn't seem to make sense to tag every
  // field or enum value with when the file is deprecated.
  bool isFileLevelDeprecation = false;
  if (!isDeprecated && file) {
    isFileLevelDeprecation = file->options().deprecated();
    isDeprecated = isFileLevelDeprecation;
  }
  if (isDeprecated) {
    std::string message;
    const FileDescriptor* sourceFile = descriptor->file();
    if (isFileLevelDeprecation) {
      message = absl::StrCat(sourceFile->name(), " is deprecated.");
    } else {
      message = absl::StrCat(descriptor->full_name(), " is deprecated (see ",
                             sourceFile->name(), ").");
    }

    return absl::StrCat("GPB_DEPRECATED_MSG(\"", message, "\")");
  } else {
    return "";
  }
}